

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-getsockname.c
# Opt level: O0

void check_sockname(sockaddr *addr,char *compare_ip,int compare_port,char *context)

{
  uint16_t uVar1;
  int iVar2;
  char local_68 [4];
  int r;
  char check_ip [17];
  undefined1 local_48 [8];
  sockaddr_in compare_addr;
  sockaddr_in check_addr;
  char *context_local;
  int compare_port_local;
  char *compare_ip_local;
  sockaddr *addr_local;
  
  compare_addr.sin_zero = *(uchar (*) [8])addr;
  iVar2 = uv_ip4_addr(compare_ip,compare_port,(sockaddr_in *)local_48);
  if (iVar2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-getsockname.c"
            ,0x56,"0 == uv_ip4_addr(compare_ip, compare_port, &compare_addr)");
    abort();
  }
  if (compare_addr.sin_zero._0_2_ != 2) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-getsockname.c"
            ,0x59,"check_addr.sin_family == AF_INET");
    abort();
  }
  if (local_48._0_2_ != 2) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-getsockname.c"
            ,0x5a,"compare_addr.sin_family == AF_INET");
    abort();
  }
  if (compare_addr.sin_zero._4_4_ != local_48._4_4_) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-getsockname.c"
            ,0x5f,
            "memcmp(&check_addr.sin_addr, &compare_addr.sin_addr, sizeof compare_addr.sin_addr) == 0"
           );
    abort();
  }
  if ((compare_port != 0) && (compare_addr.sin_zero._2_2_ != local_48._2_2_)) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-getsockname.c"
            ,0x62,"compare_port == 0 || check_addr.sin_port == compare_addr.sin_port");
    abort();
  }
  iVar2 = uv_ip4_name((sockaddr_in *)compare_addr.sin_zero,local_68,0x11);
  if (iVar2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-getsockname.c"
            ,0x65,"r == 0");
    abort();
  }
  uVar1 = ntohs(compare_addr.sin_zero._2_2_);
  printf("%s: %s:%d\n",context,local_68,(ulong)uVar1);
  return;
}

Assistant:

static void check_sockname(struct sockaddr* addr, const char* compare_ip,
  int compare_port, const char* context) {
  struct sockaddr_in check_addr = *(struct sockaddr_in*) addr;
  struct sockaddr_in compare_addr;
  char check_ip[17];
  int r;

  ASSERT(0 == uv_ip4_addr(compare_ip, compare_port, &compare_addr));

  /* Both addresses should be ipv4 */
  ASSERT(check_addr.sin_family == AF_INET);
  ASSERT(compare_addr.sin_family == AF_INET);

  /* Check if the ip matches */
  ASSERT(memcmp(&check_addr.sin_addr,
         &compare_addr.sin_addr,
         sizeof compare_addr.sin_addr) == 0);

  /* Check if the port matches. If port == 0 anything goes. */
  ASSERT(compare_port == 0 || check_addr.sin_port == compare_addr.sin_port);

  r = uv_ip4_name(&check_addr, (char*) check_ip, sizeof check_ip);
  ASSERT(r == 0);

  printf("%s: %s:%d\n", context, check_ip, ntohs(check_addr.sin_port));
}